

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds01_pair_sum.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  int iVar7;
  _Base_ptr p_Var8;
  key_type *__k;
  bool bVar9;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mi;
  int local_3c;
  uint local_38;
  int tgt;
  int n;
  
  uStack_80 = 0x101219;
  __isoc99_scanf("%d%d",&local_38,&tgt);
  lVar1 = -((ulong)local_38 * 4 + 0xf & 0xfffffffffffffff0);
  mi._M_t._M_impl._0_4_ = 0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mi;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&mi;
  mi._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_78;
  iVar7 = tgt;
  if (0 < (int)local_38) {
    lVar4 = 0;
    __k = (key_type *)(local_78 + lVar1);
    mi._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_78;
    do {
      *(undefined8 *)(local_78 + lVar1 + -8) = 0x101273;
      __isoc99_scanf("%d",__k);
      *(undefined8 *)(local_78 + lVar1 + -8) = 0x10127e;
      pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_78,__k);
      *pmVar2 = *pmVar2 + 1;
      lVar4 = lVar4 + 1;
      __k = __k + 1;
      iVar7 = tgt;
    } while (lVar4 < (int)local_38);
  }
joined_r0x00101294:
  do {
    tgt = iVar7 + -1;
    if (iVar7 == 0) {
      *(undefined8 *)(local_78 + lVar1 + -8) = 0x1013a5;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_78);
      return 0;
    }
    *(undefined8 *)(local_78 + lVar1 + -8) = 0x1012b2;
    __isoc99_scanf("%d");
    uVar3 = (ulong)(int)local_38;
    bVar9 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      uVar5 = 0;
      do {
        iVar7 = *(int *)((long)(local_78 + lVar1) + uVar5 * 4);
        p_Var8 = (_Base_ptr)&mi;
        p_Var6 = (_Base_ptr)mi._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        if (iVar7 * 2 == local_3c) {
          for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(int *)(p_Var6 + 1) < iVar7]
              ) {
            if (iVar7 <= *(int *)(p_Var6 + 1)) {
              p_Var8 = p_Var6;
            }
          }
          p_Var6 = (_Base_ptr)&mi;
          if ((p_Var8 != (_Base_ptr)&mi) && (p_Var6 = p_Var8, iVar7 < (int)p_Var8[1]._M_color)) {
            p_Var6 = (_Base_ptr)&mi;
          }
          if (1 < *(int *)&p_Var6[1].field_0x4) {
LAB_00101374:
            *(undefined8 *)(local_78 + lVar1 + -8) = 0x101380;
            puts("YES");
            iVar7 = tgt;
            if (bVar9) goto joined_r0x00101294;
            break;
          }
        }
        else {
          iVar7 = local_3c - iVar7;
          p_Var6 = (_Base_ptr)&mi;
          for (p_Var8 = (_Base_ptr)mi._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
              p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(int *)(p_Var8 + 1) < iVar7]) {
            if (iVar7 <= *(int *)(p_Var8 + 1)) {
              p_Var6 = p_Var8;
            }
          }
          p_Var8 = (_Base_ptr)&mi;
          if ((p_Var6 != (_Base_ptr)&mi) && (p_Var8 = p_Var6, iVar7 < (int)p_Var6[1]._M_color)) {
            p_Var8 = (_Base_ptr)&mi;
          }
          if (p_Var8 != (_Base_ptr)&mi) goto LAB_00101374;
        }
        uVar5 = uVar5 + 1;
        bVar9 = uVar5 < uVar3;
      } while (uVar5 != uVar3);
    }
    *(undefined8 *)(local_78 + lVar1 + -8) = 0x101392;
    puts("NO");
    iVar7 = tgt;
  } while( true );
}

Assistant:

int main() {
    int n, m;
    scanf("%d%d", &n, &m);
    int arr[n];
    map<int, int> mi;
    for (int i = 0; i < n; ++i) {
        scanf("%d", &arr[i]);
        mi[arr[i]]++;
    }
wl:
    while (m--) {
        int tgt;
        scanf("%d", &tgt);
        for (int i = 0; i < n; ++i) {
            if (2 * arr[i] == tgt) {
                if (mi.find(arr[i])->second > 1) {
                    printf("YES\n");
                    goto wl;
                }
            } else if (mi.find(tgt - arr[i]) != mi.end()) {
                printf("YES\n");
                goto wl;
            }
        }
        printf("NO\n");
    }
}